

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flcFORTRAN_wrap.cxx
# Opt level: O2

void SWIG_store_exception(char *decl,int errcode,char *msg)

{
  int iVar1;
  
  flc_ierr = errcode;
  if (SWIG_store_exception::last_exception_msg_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&SWIG_store_exception::last_exception_msg_abi_cxx11_);
    if (iVar1 != 0) {
      SWIG_store_exception::last_exception_msg_abi_cxx11_._M_dataplus._M_p =
           (pointer)&SWIG_store_exception::last_exception_msg_abi_cxx11_.field_2;
      SWIG_store_exception::last_exception_msg_abi_cxx11_._M_string_length = 0;
      SWIG_store_exception::last_exception_msg_abi_cxx11_.field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &SWIG_store_exception::last_exception_msg_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&SWIG_store_exception::last_exception_msg_abi_cxx11_);
    }
  }
  std::__cxx11::string::assign((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  std::__cxx11::string::append((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  std::__cxx11::string::append((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  std::__cxx11::string::append((char *)&SWIG_store_exception::last_exception_msg_abi_cxx11_);
  swig_last_exception_cstr = SWIG_store_exception::last_exception_msg_abi_cxx11_._M_dataplus._M_p;
  return;
}

Assistant:

SWIGEXPORT void SWIG_store_exception(const char *decl,
                                     int errcode,
                                     const char *msg) {
  ::flc_ierr = errcode;

  static std::string last_exception_msg;
  // Save the message to a std::string first
  last_exception_msg = "In ";
  last_exception_msg += decl;
  last_exception_msg += ": ";
  last_exception_msg += msg;
  swig_last_exception_cstr = last_exception_msg.c_str();
}